

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_> *
deqp::egl::Image::createTextureImageSource
          (MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>
           *__return_storage_ptr__,EGLenum source,GLenum internalFormat,GLenum format,GLenum type,
          bool useTexLevel0)

{
  Texture2DImageSource *this;
  TextureCubeMapImageSource *this_00;
  DefaultDeleter<deqp::egl::Image::ImageSource> local_36;
  DefaultDeleter<deqp::egl::Image::ImageSource> local_35 [20];
  byte local_21;
  GLenum local_20;
  GLenum GStack_1c;
  bool useTexLevel0_local;
  GLenum type_local;
  GLenum format_local;
  GLenum internalFormat_local;
  EGLenum source_local;
  
  local_21 = useTexLevel0;
  local_20 = type;
  GStack_1c = format;
  type_local = internalFormat;
  format_local = source;
  _internalFormat_local = __return_storage_ptr__;
  if (source == 0x30b1) {
    this = (Texture2DImageSource *)operator_new(0x18);
    Texture2DImageSource::Texture2DImageSource
              (this,type_local,GStack_1c,local_20,(bool)(local_21 & 1));
    de::DefaultDeleter<deqp::egl::Image::ImageSource>::DefaultDeleter(local_35);
    de::details::
    MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
    MovePtr(__return_storage_ptr__,this);
  }
  else {
    this_00 = (TextureCubeMapImageSource *)operator_new(0x20);
    TextureCubeMapImageSource::TextureCubeMapImageSource
              (this_00,format_local,type_local,GStack_1c,local_20,(bool)(local_21 & 1));
    de::DefaultDeleter<deqp::egl::Image::ImageSource>::DefaultDeleter(&local_36);
    de::details::
    MovePtr<deqp::egl::Image::ImageSource,_de::DefaultDeleter<deqp::egl::Image::ImageSource>_>::
    MovePtr(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ImageSource> createTextureImageSource (EGLenum source, GLenum internalFormat, GLenum format, GLenum type, bool useTexLevel0)
{
	if (source == EGL_GL_TEXTURE_2D_KHR)
		return MovePtr<ImageSource>(new Texture2DImageSource(internalFormat, format, type, useTexLevel0));
	else
		return MovePtr<ImageSource>(new TextureCubeMapImageSource(source, internalFormat, format, type, useTexLevel0));
}